

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

void al_draw_textf(ALLEGRO_FONT *font,ALLEGRO_COLOR color,float x,float y,int flags,char *format,...
                  )

{
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  int iVar1;
  undefined8 in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  char *s;
  va_list ap;
  ALLEGRO_USTR *buf;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  ALLEGRO_FONT *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  char local_58 [8];
  undefined1 *local_50;
  undefined1 *local_48;
  undefined8 local_38;
  char *local_30;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_30 = in_RDX;
  local_24 = in_ESI;
  local_20 = in_XMM3_Da;
  local_1c = in_XMM2_Da;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  local_8 = in_XMM1_Qa;
  iVar1 = strcmp(in_RDX,"%s");
  if (iVar1 == 0) {
    local_48 = &stack0xfffffffffffffee8;
    local_50 = &stack0x00000008;
    local_58[4] = 'p';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[0] = ' ';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    color_00.b = (float)(int)in_RCX;
    color_00.a = (float)(int)((ulong)in_RCX >> 0x20);
    color_00.r = (float)(int)in_stack_fffffffffffffef8;
    color_00.g = (float)(int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    al_draw_text(in_stack_fffffffffffffef0,color_00,in_stack_fffffffffffffeec,
                 in_stack_fffffffffffffee8,0x18,local_58);
  }
  else {
    local_48 = &stack0xfffffffffffffee8;
    local_50 = &stack0x00000008;
    local_58[4] = 'p';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[0] = '\x18';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_38 = al_ustr_new("");
    al_ustr_vappendf(local_38,local_30,local_58);
    al_cstr(local_38);
    color_01.b = (float)(int)in_RCX;
    color_01.a = (float)(int)((ulong)in_RCX >> 0x20);
    color_01.r = (float)(int)in_stack_fffffffffffffef8;
    color_01.g = (float)(int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    al_draw_text(in_stack_fffffffffffffef0,color_01,in_stack_fffffffffffffeec,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
    al_ustr_free(local_38);
  }
  return;
}

Assistant:

void al_draw_textf(const ALLEGRO_FONT *font, ALLEGRO_COLOR color,
   float x, float y, int flags,
   const char *format, ...)
{
   ALLEGRO_USTR *buf;
   va_list ap;
   const char *s;
   ASSERT(font);
   ASSERT(format);

   /* Fast path for common case. */
   if (0 == strcmp(format, "%s")) {
      va_start(ap, format);
      s = va_arg(ap, const char *);
      al_draw_text(font, color, x, y, flags, s);
      va_end(ap);
      return;
   }

   va_start(ap, format);
   buf = al_ustr_new("");
   al_ustr_vappendf(buf, format, ap);
   va_end(ap);

   al_draw_text(font, color, x, y, flags, al_cstr(buf));

   al_ustr_free(buf);
}